

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O3

void __thiscall
TEST_CommandLineTestRunner_JunitOutputEnabled_Test::testBody
          (TEST_CommandLineTestRunner_JunitOutputEnabled_Test *this)

{
  StringBufferTestOutput *pSVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  
  argv[0] = "tests.exe";
  argv[1] = "-ojunit";
  CommandLineTestRunner::CommandLineTestRunner
            (&commandLineTestRunner.super_CommandLineTestRunner,2,argv,
             &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  commandLineTestRunner.super_CommandLineTestRunner._vptr_CommandLineTestRunner =
       (_func_int **)&PTR__CommandLineTestRunner_00348440;
  commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_ = (StringBufferTestOutput *)0x0;
  commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer = (StringBufferTestOutput *)0x0;
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer = (StringBufferTestOutput *)0x0;
  CommandLineTestRunner::runAllTestsMain(&commandLineTestRunner.super_CommandLineTestRunner);
  pUVar2 = UtestShell::getCurrent();
  pSVar1 = commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(pSVar1 != (StringBufferTestOutput *)0x0),"CHECK",
             "commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_ != NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,200,pTVar3);
  CommandLineTestRunner::~CommandLineTestRunner(&commandLineTestRunner.super_CommandLineTestRunner);
  return;
}

Assistant:

TEST(CommandLineTestRunner, JunitOutputEnabled)
{
    const char* argv[] = { "tests.exe", "-ojunit"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();
    CHECK(commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_ != NULLPTR);
}